

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

ExceptionOr<kj::HttpInputStream::Message> * __thiscall
kj::_::ExceptionOr<kj::HttpInputStream::Message>::operator=
          (ExceptionOr<kj::HttpInputStream::Message> *this,
          ExceptionOr<kj::HttpInputStream::Message> *param_1)

{
  AsyncInputStream *pAVar1;
  Disposer *pDVar2;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      pAVar1 = (this->value).ptr.field_1.value.body.ptr;
      if (pAVar1 != (AsyncInputStream *)0x0) {
        (this->value).ptr.field_1.value.body.ptr = (AsyncInputStream *)0x0;
        pDVar2 = (this->value).ptr.field_1.value.body.disposer;
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,pAVar1->_vptr_AsyncInputStream[-2] + (long)&pAVar1->_vptr_AsyncInputStream
                  );
      }
    }
    if ((param_1->value).ptr.isSet == true) {
      (this->value).ptr.field_1.value.headers = (param_1->value).ptr.field_1.value.headers;
      pAVar1 = (param_1->value).ptr.field_1.value.body.ptr;
      (this->value).ptr.field_1.value.body.disposer =
           (param_1->value).ptr.field_1.value.body.disposer;
      (this->value).ptr.field_1.value.body.ptr = pAVar1;
      (param_1->value).ptr.field_1.value.body.ptr = (AsyncInputStream *)0x0;
      (this->value).ptr.isSet = true;
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;